

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doomtype.h
# Opt level: O1

int __thiscall FListMenuItemPatch::GetWidth(FListMenuItemPatch *this)

{
  uint uVar1;
  long lVar2;
  
  lVar2 = (long)*(int *)&(this->super_FListMenuItemSelectable).field_0x24;
  if (0 < lVar2) {
    uVar1 = (uint)((double)((uint)(TexMan.Textures.Array[lVar2].Texture)->Width * 2) /
                  ((TexMan.Textures.Array[lVar2].Texture)->Scale).X);
    return (uVar1 & 1) + ((int)uVar1 >> 1);
  }
  return 0;
}

Assistant:

bool isValid() const { return texnum > 0; }